

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsMan.c
# Opt level: O3

void Mfs_ManClean(Mfs_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  
  if (p->pAigWin != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pAigWin);
  }
  if (p->pCnf != (Cnf_Dat_t *)0x0) {
    Cnf_DataFree(p->pCnf);
  }
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  pVVar1 = p->vRoots;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
    }
    free(pVVar1);
  }
  pVVar1 = p->vSupp;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
    }
    free(pVVar1);
  }
  pVVar1 = p->vNodes;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
    }
    free(pVVar1);
  }
  pVVar1 = p->vDivs;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
    }
    free(pVVar1);
  }
  p->vNodes = (Vec_Ptr_t *)0x0;
  p->vDivs = (Vec_Ptr_t *)0x0;
  p->vRoots = (Vec_Ptr_t *)0x0;
  p->vSupp = (Vec_Ptr_t *)0x0;
  p->pAigWin = (Aig_Man_t *)0x0;
  p->pCnf = (Cnf_Dat_t *)0x0;
  p->pSat = (sat_solver *)0x0;
  return;
}

Assistant:

void Mfs_ManClean( Mfs_Man_t * p )
{
    if ( p->pAigWin )
        Aig_ManStop( p->pAigWin );
    if ( p->pCnf )
        Cnf_DataFree( p->pCnf );
    if ( p->pSat )
        sat_solver_delete( p->pSat );
    if ( p->vRoots )
        Vec_PtrFree( p->vRoots );
    if ( p->vSupp )
        Vec_PtrFree( p->vSupp );
    if ( p->vNodes )
        Vec_PtrFree( p->vNodes );
    if ( p->vDivs )
        Vec_PtrFree( p->vDivs );
    p->pAigWin = NULL;
    p->pCnf    = NULL;
    p->pSat    = NULL;
    p->vRoots  = NULL;
    p->vSupp   = NULL;
    p->vNodes  = NULL;
    p->vDivs   = NULL;
}